

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O2

int transposepara(int f,int n)

{
  char cVar1;
  mgwin *pmVar2;
  uint in_EAX;
  int iVar3;
  undefined8 uStack_38;
  int i;
  
  uStack_38 = (ulong)in_EAX;
  if (n == 0) {
    iVar3 = 1;
  }
  else {
    undo_boundary_enable(8,0);
    gotobop(8,1);
    pmVar2 = curwp;
    curwp->w_markp = curwp->w_dotp;
    pmVar2->w_marko = pmVar2->w_doto;
    gotoeop(8,1);
    cVar1 = curbp->b_flag;
    kdelete();
    iVar3 = killregion(8,1);
    if (iVar3 == 1) {
      iVar3 = do_gotoeop(8,n,(int *)((long)&uStack_38 + 4));
      if (iVar3 == 0) {
        iVar3 = 0;
        ewprintf("Cannot transpose paragraph, end of buffer reached.");
        gotobop(8,uStack_38._4_4_);
        yank(8,1);
        curbp->b_flag = cVar1;
      }
      else {
        yank(8,1);
        undo_boundary_enable(8,1);
        iVar3 = 1;
      }
    }
  }
  return iVar3;
}

Assistant:

int
transposepara(int f, int n)
{
	int	i = 0, status;
	char	flg;

	if (n == 0)
		return (TRUE);

	undo_boundary_enable(FFRAND, 0);

	/* find a paragraph, set mark, then goto the end */
	gotobop(FFRAND, 1);
	curwp->w_markp = curwp->w_dotp;
	curwp->w_marko = curwp->w_doto;
	(void)gotoeop(FFRAND, 1);

	/* take a note of buffer flags - we may need them */
	flg = curbp->b_flag;	

	/* clean out kill buffer then kill region */
	kdelete();
	if ((status = killregion(FFRAND, 1)) != TRUE)
		return (status);

	/* 
	 * Now step through n paragraphs. If we reach the end of buffer,
	 * stop and paste the killed region back, then display a message.
	 */
	if (do_gotoeop(FFRAND, n, &i) == FALSE) {
		ewprintf("Cannot transpose paragraph, end of buffer reached.");
		(void)gotobop(FFRAND, i);
		(void)yank(FFRAND, 1);
		curbp->b_flag = flg;	
		return (FALSE);
	}
	(void)yank(FFRAND, 1);

	undo_boundary_enable(FFRAND, 1);

	return (TRUE);
}